

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.c
# Opt level: O2

char * setGroupList(econf_file *key_file,char *name)

{
  int iVar1;
  char *pcVar2;
  char **ppcVar3;
  
  pcVar2 = getFromGroupList(key_file,name);
  if (pcVar2 == (char *)0x0) {
    iVar1 = key_file->group_count;
    key_file->group_count = iVar1 + 1;
    ppcVar3 = (char **)realloc(key_file->groups,(long)iVar1 * 8 + 0x10);
    key_file->groups = ppcVar3;
    iVar1 = key_file->group_count;
    if (ppcVar3 == (char **)0x0) {
      key_file->group_count = iVar1 + -1;
      pcVar2 = (char *)0x0;
    }
    else {
      ppcVar3[iVar1] = (char *)0x0;
      pcVar2 = strdup(name);
      ppcVar3[(long)iVar1 + -1] = pcVar2;
    }
  }
  return pcVar2;
}

Assistant:

char *setGroupList(econf_file *key_file, const char *name) {
  char *ret = getFromGroupList(key_file, name);
  if (ret != NULL)
    return ret;
  key_file->group_count++;
  key_file->groups =
    realloc(key_file->groups, (key_file->group_count +1) * sizeof(char *));
  if (key_file->groups == NULL) {
    key_file->group_count--;
  } else {
    key_file->groups[key_file->group_count] = NULL;
    key_file->groups[key_file->group_count-1] = strdup(name);
    ret = key_file->groups[key_file->group_count-1];
  }
  return ret;
}